

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templates.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  stringstream str;
  long *local_1b0 [2];
  long local_1a0 [2];
  stringstream local_190 [16];
  ostream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>(local_180,"Square",6);
  std::__cxx11::stringbuf::str();
  iVar1 = std::__cxx11::string::compare((char *)local_1b0);
  if (iVar1 == 0) {
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0],local_1a0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_190);
    std::ios_base::~ios_base(local_110);
    return 0;
  }
  __assert_fail("\"Square\" == str.str()",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/polymorphism/templates.cpp"
                ,0x23,"int main()");
}

Assistant:

int main() {
  std::stringstream str{};
  auto example = config().create<App>();
  example.draw(str);
  assert("Square" == str.str());
}